

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_ManCollectLeaves_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vLeaves,int fFirst)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int fFirst_local;
  Vec_Int_t *vLeaves_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if ((*(long *)pObj < 0) && (fFirst == 0)) {
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPushUnique(vLeaves,iVar1);
  }
  else {
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0xef,
                    "void Ga2_ManCollectLeaves_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)");
    }
    pGVar2 = Gia_ObjFanin0(pObj);
    Ga2_ManCollectLeaves_rec(p,pGVar2,vLeaves,0);
    pGVar2 = Gia_ObjFanin1(pObj);
    Ga2_ManCollectLeaves_rec(p,pGVar2,vLeaves,0);
  }
  return;
}

Assistant:

void Ga2_ManCollectLeaves_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vLeaves, int fFirst )
{
    if ( pObj->fPhase && !fFirst )
    {
        Vec_IntPushUnique( vLeaves, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Ga2_ManCollectLeaves_rec( p, Gia_ObjFanin0(pObj), vLeaves, 0 );
    Ga2_ManCollectLeaves_rec( p, Gia_ObjFanin1(pObj), vLeaves, 0 );
}